

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ec_asn1.cc
# Opt level: O2

EC_GROUP * EC_KEY_parse_curve_name(CBS *cbs)

{
  int iVar1;
  EC_GROUP *pEVar2;
  int line;
  long lVar3;
  CBS named_curve;
  
  iVar1 = CBS_get_asn1(cbs,&named_curve,6);
  if (iVar1 == 0) {
    iVar1 = 0x80;
    line = 0x12d;
LAB_001a2314:
    pEVar2 = (EC_GROUP *)0x0;
    ERR_put_error(0xf,0,iVar1,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/ec/ec_asn1.cc"
                  ,line);
  }
  else {
    lVar3 = 0;
    do {
      if (lVar3 == 0x20) {
        iVar1 = 0x7b;
        line = 0x139;
        goto LAB_001a2314;
      }
      pEVar2 = (EC_GROUP *)(**(code **)((long)kAllGroups + lVar3))();
      iVar1 = CBS_mem_equal(&named_curve,pEVar2->oid,(ulong)pEVar2->oid_len);
      lVar3 = lVar3 + 8;
    } while (iVar1 == 0);
  }
  return pEVar2;
}

Assistant:

EC_GROUP *EC_KEY_parse_curve_name(CBS *cbs) {
  CBS named_curve;
  if (!CBS_get_asn1(cbs, &named_curve, CBS_ASN1_OBJECT)) {
    OPENSSL_PUT_ERROR(EC, EC_R_DECODE_ERROR);
    return NULL;
  }

  // Look for a matching curve.
  for (size_t i = 0; i < OPENSSL_ARRAY_SIZE(kAllGroups); i++) {
    const EC_GROUP *group = kAllGroups[i]();
    if (CBS_mem_equal(&named_curve, group->oid, group->oid_len)) {
      return (EC_GROUP *)group;
    }
  }

  OPENSSL_PUT_ERROR(EC, EC_R_UNKNOWN_GROUP);
  return NULL;
}